

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall NNTreeImpl::repair(NNTreeImpl *this)

{
  bool bVar1;
  string *psVar2;
  QPDFObjectHandle local_230;
  allocator<char> local_219;
  string local_218 [32];
  QPDFObjectHandle local_1f8;
  allocator<char> local_1e1;
  string local_1e0;
  QPDFObjectHandle local_1c0;
  QPDFObjectHandle local_1b0;
  iterator local_1a0;
  reference local_140;
  T *i;
  iterator __end1;
  iterator __begin1;
  NNTreeImpl *__range1;
  NNTreeImpl repl;
  undefined1 local_20 [8];
  QPDFObjectHandle new_node;
  NNTreeImpl *this_local;
  
  new_node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHandle::newDictionary();
  psVar2 = (string *)(*(code *)**(undefined8 **)this->details)();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_20,psVar2,(QPDFObjectHandle *)&repl.auto_repair);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&repl.auto_repair);
  NNTreeImpl((NNTreeImpl *)&__range1,this->details,this->qpdf,(QPDFObjectHandle *)local_20,false);
  begin((iterator *)
        &__end1.ivalue.second.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this);
  end((iterator *)&i,this);
  while( true ) {
    bVar1 = NNTreeIterator::operator!=
                      ((NNTreeIterator *)
                       &__end1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (NNTreeIterator *)&i);
    if (!bVar1) break;
    local_140 = NNTreeIterator::operator*
                          ((NNTreeIterator *)
                           &__end1.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFObjectHandle(&local_1b0,&local_140->first);
    QPDFObjectHandle::QPDFObjectHandle(&local_1c0,&local_140->second);
    insert(&local_1a0,(NNTreeImpl *)&__range1,&local_1b0,&local_1c0);
    NNTreeIterator::~NNTreeIterator(&local_1a0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1b0);
    NNTreeIterator::operator++
              ((NNTreeIterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)&i);
  NNTreeIterator::~NNTreeIterator
            ((NNTreeIterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"/Kids",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"/Kids",&local_219);
  QPDFObjectHandle::getKey(&local_1f8,(string *)local_20);
  QPDFObjectHandle::replaceKey(&this->oh,&local_1e0,&local_1f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  psVar2 = (string *)(*(code *)**(undefined8 **)this->details)();
  (*(code *)**(undefined8 **)this->details)();
  QPDFObjectHandle::getKey(&local_230,(string *)local_20);
  QPDFObjectHandle::replaceKey(&this->oh,psVar2,&local_230);
  QPDFObjectHandle::~QPDFObjectHandle(&local_230);
  ~NNTreeImpl((NNTreeImpl *)&__range1);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_20);
  return;
}

Assistant:

void
NNTreeImpl::repair()
{
    auto new_node = QPDFObjectHandle::newDictionary();
    new_node.replaceKey(details.itemsKey(), QPDFObjectHandle::newArray());
    NNTreeImpl repl(details, qpdf, new_node, false);
    for (auto const& i: *this) {
        repl.insert(i.first, i.second);
    }
    this->oh.replaceKey("/Kids", new_node.getKey("/Kids"));
    this->oh.replaceKey(details.itemsKey(), new_node.getKey(details.itemsKey()));
}